

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall
ProblemTest_InvalidLogicalConIndex_Test::TestBody(ProblemTest_InvalidLogicalConIndex_Test *this)

{
  LogicalConstant expr;
  char *pcVar1;
  int iVar2;
  bool bVar3;
  AssertHelper local_3b0;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  iVar2 = 3;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    expr = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                     (&p.super_ExprFactory,true);
    mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
              (&p,(LogicalExpr)
                  expr.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_)
    ;
  }
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_3b0);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con(&p,-1);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: p.logical_con(-1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar1 = "";
  }
  else {
    pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x1c8,pcVar1);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid index",(allocator<char> *)&local_3b0);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con(&p,3);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [109])
               "Expected: p.logical_con(num_cons) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar1 = "";
  }
  else {
    pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x1c9,pcVar1);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, InvalidLogicalConIndex) {
  Problem p;
  const int num_cons = 3;
  for (int i = 0; i < num_cons; ++i)
    p.AddCon(p.MakeLogicalConstant(true));
  EXPECT_ASSERT(p.logical_con(-1), "invalid index");
  EXPECT_ASSERT(p.logical_con(num_cons), "invalid index");
}